

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue.cpp
# Opt level: O0

void __thiscall llbuild::buildsystem::BuildValue::dump(BuildValue *this,raw_ostream *os)

{
  bool bVar1;
  uint uVar2;
  raw_ostream *prVar3;
  size_type sVar4;
  reference pvVar5;
  StringRef SVar6;
  uint local_54;
  undefined1 local_50 [4];
  uint i_1;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> values;
  FileInfo *info;
  uint i;
  raw_ostream *os_local;
  BuildValue *this_local;
  
  prVar3 = llvm::raw_ostream::operator<<(os,"BuildValue(");
  SVar6 = stringForKind(this->kind);
  llvm::raw_ostream::operator<<(prVar3,SVar6);
  bVar1 = kindHasSignature(this);
  if (bVar1) {
    prVar3 = llvm::raw_ostream::operator<<(os,", signature=");
    llvm::raw_ostream::operator<<(prVar3,(this->signature).value);
  }
  bVar1 = kindHasOutputInfo(this);
  if (bVar1) {
    llvm::raw_ostream::operator<<(os,", outputInfos=[");
    for (info._4_4_ = 0; uVar2 = getNumOutputs(this), info._4_4_ != uVar2;
        info._4_4_ = info._4_4_ + 1) {
      values.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)getNthOutputInfo(this,info._4_4_);
      if (info._4_4_ != 0) {
        llvm::raw_ostream::operator<<(os,", ");
      }
      bVar1 = llbuild::basic::FileInfo::isMissing
                        ((FileInfo *)
                         values.
                         super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        llvm::raw_ostream::operator<<(os,"FileInfo{/*missing*/}");
      }
      else {
        prVar3 = llvm::raw_ostream::operator<<(os,"FileInfo{");
        prVar3 = llvm::raw_ostream::operator<<(prVar3,"dev=");
        prVar3 = llvm::raw_ostream::operator<<
                           (prVar3,(unsigned_long)
                                   (values.
                                    super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->Data);
        prVar3 = llvm::raw_ostream::operator<<(prVar3,", inode=");
        prVar3 = llvm::raw_ostream::operator<<
                           (prVar3,(values.
                                    super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->Length);
        prVar3 = llvm::raw_ostream::operator<<(prVar3,", mode=");
        prVar3 = llvm::raw_ostream::operator<<
                           (prVar3,(unsigned_long)
                                   values.
                                   super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage[1].Data);
        prVar3 = llvm::raw_ostream::operator<<(prVar3,", size=");
        prVar3 = llvm::raw_ostream::operator<<
                           (prVar3,values.
                                   super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage[1].Length);
        prVar3 = llvm::raw_ostream::operator<<(prVar3,", modTime=(");
        prVar3 = llvm::raw_ostream::operator<<
                           (prVar3,(unsigned_long)
                                   values.
                                   super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage[2].Data);
        prVar3 = llvm::raw_ostream::operator<<(prVar3,":");
        prVar3 = llvm::raw_ostream::operator<<
                           (prVar3,values.
                                   super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage[2].Length);
        llvm::raw_ostream::operator<<(prVar3,"}");
      }
    }
    llvm::raw_ostream::operator<<(os,"]");
  }
  bVar1 = kindHasStringList(this);
  if (bVar1) {
    getStringListValues((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_50,this);
    llvm::raw_ostream::operator<<(os,", values=[");
    for (local_54 = 0;
        sVar4 = std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::size
                          ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_50),
        local_54 != sVar4; local_54 = local_54 + 1) {
      if (local_54 != 0) {
        llvm::raw_ostream::operator<<(os,", ");
      }
      llvm::raw_ostream::operator<<(os,'\"');
      pvVar5 = std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::operator[]
                         ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_50,
                          (ulong)local_54);
      SVar6.Data = pvVar5->Data;
      SVar6.Length = pvVar5->Length;
      llvm::raw_ostream::write_escaped(os,SVar6,false);
      llvm::raw_ostream::operator<<(os,'\"');
    }
    llvm::raw_ostream::operator<<(os,"]");
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~vector
              ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_50);
  }
  llvm::raw_ostream::operator<<(os,")");
  return;
}

Assistant:

void BuildValue::dump(raw_ostream& os) const {
  os << "BuildValue(" << stringForKind(kind);
  if (kindHasSignature()) {
    os << ", signature=" << signature.value;
  }
  if (kindHasOutputInfo()) {
    os << ", outputInfos=[";
    for (unsigned i = 0; i != getNumOutputs(); ++i) {
      auto& info = getNthOutputInfo(i);
      if (i != 0) os << ", ";
      if (info.isMissing()) {
        os << "FileInfo{/*missing*/}";
      } else {
        os << "FileInfo{"
           << "dev=" << info.device
           << ", inode=" << info.inode
           << ", mode=" << info.mode
           << ", size=" << info.size
           << ", modTime=(" << info.modTime.seconds
           << ":" << info.modTime.nanoseconds << "}";
      }
    }
    os << "]";
  }
  if (kindHasStringList()) {
    std::vector<StringRef> values = getStringListValues();
    os << ", values=[";
    for (unsigned i = 0; i != values.size(); ++i) {
      if (i != 0) os << ", ";
      os << '"';
      os.write_escaped(values[i]);
      os << '"';
    }
    os << "]";
  }
  os << ")";
}